

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
TypeClass::TypeClass
          (TypeClass *this,Allocator *allocator,SynIdentifier *identifier,SynBase *source,
          ScopeData *scope,TypeGenericClassProto *proto,IntrusiveList<MatchData> generics,
          bool extendable,TypeClass *baseClass)

{
  Lexeme *pLVar1;
  Lexeme *pLVar2;
  char *pcVar3;
  char *pcVar4;
  SynBase *pSVar5;
  undefined4 uVar6;
  bool bVar7;
  
  TypeStruct::TypeStruct(&this->super_TypeStruct,0x18,identifier->name);
  (this->super_TypeStruct).super_TypeBase._vptr_TypeBase = (_func_int **)&PTR__TypeClass_00241068;
  (this->identifier).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0e8;
  uVar6 = *(undefined4 *)&(identifier->super_SynBase).field_0xc;
  pLVar1 = (identifier->super_SynBase).begin;
  pLVar2 = (identifier->super_SynBase).end;
  pcVar3 = (identifier->super_SynBase).pos.begin;
  pcVar4 = (identifier->super_SynBase).pos.end;
  pSVar5 = (identifier->super_SynBase).next;
  (this->identifier).super_SynBase.typeID = (identifier->super_SynBase).typeID;
  *(undefined4 *)&(this->identifier).super_SynBase.field_0xc = uVar6;
  (this->identifier).super_SynBase.begin = pLVar1;
  (this->identifier).super_SynBase.end = pLVar2;
  (this->identifier).super_SynBase.pos.begin = pcVar3;
  (this->identifier).super_SynBase.pos.end = pcVar4;
  (this->identifier).super_SynBase.next = pSVar5;
  bVar7 = (identifier->super_SynBase).isInternal;
  (this->identifier).super_SynBase.listed = (identifier->super_SynBase).listed;
  (this->identifier).super_SynBase.isInternal = bVar7;
  (this->identifier).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0a0;
  pcVar3 = (identifier->name).end;
  (this->identifier).name.begin = (identifier->name).begin;
  (this->identifier).name.end = pcVar3;
  this->source = source;
  this->scope = scope;
  this->proto = proto;
  (this->generics).head = generics.head;
  (this->generics).tail = generics.tail;
  (this->aliases).head = (MatchData *)0x0;
  (this->aliases).tail = (MatchData *)0x0;
  this->extendable = extendable;
  this->baseClass = baseClass;
  (this->methods).allocator = allocator;
  (this->methods).data = (this->methods).little;
  (this->methods).count = 0;
  (this->methods).max = 4;
  DirectChainedMap<FunctionData_*>::DirectChainedMap(&this->methodMap,allocator);
  this->completed = false;
  this->isInternal = false;
  this->hasFinalizer = false;
  this->defaultAssign = (FunctionData *)0x0;
  return;
}

Assistant:

TypeClass(Allocator *allocator, const SynIdentifier& identifier, SynBase *source, ScopeData *scope, TypeGenericClassProto *proto, IntrusiveList<MatchData> generics, bool extendable, TypeClass *baseClass): TypeStruct(myTypeID, identifier.name), identifier(identifier), source(source), scope(scope), proto(proto), generics(generics), extendable(extendable), baseClass(baseClass), methods(allocator), methodMap(allocator)
	{
		completed = false;
		isInternal = false;

		hasFinalizer = false;

		defaultAssign = NULL;
	}